

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

int8_t __thiscall
icu_63::UnicodeString::doCompare
          (UnicodeString *this,int32_t start,int32_t length,UChar *srcChars,int32_t srcStart,
          int32_t srcLength)

{
  UChar *pUVar1;
  ushort uVar2;
  long lVar3;
  char16_t *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  
  uVar2 = (this->fUnion).fStackFields.fLengthAndFlags;
  bVar8 = 0xff;
  if ((uVar2 & 1) == 0) {
    if ((short)uVar2 < 0) {
      iVar6 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar6 = (int)(short)uVar2 >> 5;
    }
    iVar7 = start;
    if (iVar6 < start) {
      iVar7 = iVar6;
    }
    if (start < 0) {
      iVar7 = 0;
    }
    iVar5 = iVar6 - iVar7;
    if (length <= iVar6 - iVar7) {
      iVar5 = length;
    }
    if (length < 0) {
      iVar5 = 0;
    }
    if (srcChars == (UChar *)0x0) {
      bVar8 = iVar5 != 0;
    }
    else {
      if ((uVar2 & 2) == 0) {
        pcVar4 = (this->fUnion).fFields.fArray;
      }
      else {
        pcVar4 = (char16_t *)((long)&this->fUnion + 2);
      }
      pUVar1 = srcChars + srcStart;
      if (srcLength < 0) {
        srcLength = u_strlen_63(pUVar1 + srcStart);
      }
      iVar6 = srcLength;
      if (iVar5 < srcLength) {
        iVar6 = iVar5;
      }
      bVar8 = -(iVar5 < srcLength) | 1;
      if (iVar5 == srcLength) {
        bVar8 = 0;
      }
      if ((0 < iVar6) && (pcVar4 + iVar7 != pUVar1)) {
        iVar6 = iVar6 + 1;
        lVar3 = 0;
        do {
          uVar2 = *(ushort *)((long)(pcVar4 + iVar7) + lVar3);
          if (uVar2 != *(ushort *)((long)pUVar1 + lVar3)) {
            return (byte)((uint)uVar2 - (uint)*(ushort *)((long)pUVar1 + lVar3) >> 0xf) | 1;
          }
          lVar3 = lVar3 + 2;
          iVar6 = iVar6 + -1;
        } while (1 < iVar6);
      }
    }
  }
  return bVar8;
}

Assistant:

int8_t
UnicodeString::doCompare( int32_t start,
              int32_t length,
              const UChar *srcChars,
              int32_t srcStart,
              int32_t srcLength) const
{
  // compare illegal string values
  if(isBogus()) {
    return -1;
  }
  
  // pin indices to legal values
  pinIndices(start, length);

  if(srcChars == NULL) {
    // treat const UChar *srcChars==NULL as an empty string
    return length == 0 ? 0 : 1;
  }

  // get the correct pointer
  const UChar *chars = getArrayStart();

  chars += start;
  srcChars += srcStart;

  int32_t minLength;
  int8_t lengthResult;

  // get the srcLength if necessary
  if(srcLength < 0) {
    srcLength = u_strlen(srcChars + srcStart);
  }

  // are we comparing different lengths?
  if(length != srcLength) {
    if(length < srcLength) {
      minLength = length;
      lengthResult = -1;
    } else {
      minLength = srcLength;
      lengthResult = 1;
    }
  } else {
    minLength = length;
    lengthResult = 0;
  }

  /*
   * note that uprv_memcmp() returns an int but we return an int8_t;
   * we need to take care not to truncate the result -
   * one way to do this is to right-shift the value to
   * move the sign bit into the lower 8 bits and making sure that this
   * does not become 0 itself
   */

  if(minLength > 0 && chars != srcChars) {
    int32_t result;

#   if U_IS_BIG_ENDIAN 
      // big-endian: byte comparison works
      result = uprv_memcmp(chars, srcChars, minLength * sizeof(UChar));
      if(result != 0) {
        return (int8_t)(result >> 15 | 1);
      }
#   else
      // little-endian: compare UChar units
      do {
        result = ((int32_t)*(chars++) - (int32_t)*(srcChars++));
        if(result != 0) {
          return (int8_t)(result >> 15 | 1);
        }
      } while(--minLength > 0);
#   endif
  }
  return lengthResult;
}